

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatPrinter_p.cpp
# Opt level: O2

string * __thiscall
BamTools::Internal::SamFormatPrinter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SamFormatPrinter *this)

{
  allocator local_1b9;
  string local_1b8 [32];
  stringstream out;
  
  std::__cxx11::string::string(local_1b8,"",&local_1b9);
  std::__cxx11::stringstream::stringstream((stringstream *)&out,local_1b8,_S_out|_S_in);
  std::__cxx11::string::~string(local_1b8);
  PrintHD(this,&out);
  PrintSQ(this,&out);
  PrintRG(this,&out);
  PrintPG(this,&out);
  PrintCO(this,&out);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

const string SamFormatPrinter::ToString(void) const {

    // clear out stream
    stringstream out("");

    // generate formatted header text
    PrintHD(out);
    PrintSQ(out);
    PrintRG(out);
    PrintPG(out);
    PrintCO(out);

    // return result
    return out.str();
}